

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O0

__pid_t __thiscall kmp_flag_oncore::wait(kmp_flag_oncore *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  void *in_stack_00000030;
  int in_stack_0000003c;
  kmp_flag_oncore *in_stack_00000040;
  kmp_info_t *in_stack_00000048;
  
  __kmp_wait_template<kmp_flag_oncore>
            (in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000030);
  return extraout_EAX;
}

Assistant:

void wait(kmp_info_t *this_thr, int final_spin) {
    __kmp_wait_template<kmp_flag_oncore>(
        this_thr, this, final_spin USE_ITT_BUILD_ARG(itt_sync_obj));
  }